

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_test.cpp
# Opt level: O3

void __thiscall FFT_Benchmark1e4_Test::TestBody(FFT_Benchmark1e4_Test *this)

{
  bool bVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__s;
  pointer __s_00;
  value_type_conflict1 *__val_1;
  char *message;
  value_type_conflict1 *__val;
  int j;
  long lVar3;
  undefined1 local_a8 [8];
  vector<long_long,_std::allocator<long_long>_> res;
  vector<long_long,_std::allocator<long_long>_> want;
  AssertionResult gtest_ar;
  vector<long_long,_std::allocator<long_long>_> local_50;
  AssertHelper local_38;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  
  __s = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(80000);
  gtest_ar.message_.ptr_ = __s;
  memset(__s,0,80000);
  __s_00 = (pointer)operator_new(80000);
  lVar3 = 0;
  local_50.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
  ._M_start = __s_00;
  local_50.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = __s_00 + 10000;
  memset(__s_00,0,80000);
  local_50.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
  ._M_finish = __s_00 + 10000;
  do {
    iVar2 = rand();
    (&__s->_M_dataplus)[lVar3]._M_p = (pointer)(long)(iVar2 % 200000 + -100000);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 10000);
  lVar3 = 0;
  do {
    iVar2 = rand();
    __s_00[lVar3] = (long)(iVar2 % 200000 + -100000);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 10000);
  multiplyPolynomials((vector<long_long,_std::allocator<long_long>_> *)local_a8,
                      (vector<long_long,_std::allocator<long_long>_> *)&gtest_ar.message_,&local_50)
  ;
  std::vector<long_long,_std::allocator<long_long>_>::resize
            ((vector<long_long,_std::allocator<long_long>_> *)&gtest_ar.message_,10);
  std::vector<long_long,_std::allocator<long_long>_>::resize(&local_50,10);
  multiplyNaive((vector<long_long,_std::allocator<long_long>_> *)
                &res.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
                (vector<long_long,_std::allocator<long_long>_> *)&gtest_ar.message_,&local_50);
  std::vector<long_long,_std::allocator<long_long>_>::resize
            ((vector<long_long,_std::allocator<long_long>_> *)
             &res.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,10);
  std::vector<long_long,_std::allocator<long_long>_>::resize
            ((vector<long_long,_std::allocator<long_long>_> *)local_a8,10);
  testing::internal::
  CmpHelperEQ<std::vector<long_long,std::allocator<long_long>>,std::vector<long_long,std::allocator<long_long>>>
            ((internal *)
             &want.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,"want","res",
             (vector<long_long,_std::allocator<long_long>_> *)
             &res.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<long_long,_std::allocator<long_long>_> *)local_a8);
  if ((char)want.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage == '\0') {
    testing::Message::Message((Message *)&local_30);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/numerical/fft_test.cpp"
               ,0x44,message);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_30.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_30.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (res.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)0x0) {
    operator_delete(res.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if (local_a8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_a8);
  }
  if (local_50.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar.message_.ptr_);
  }
  return;
}

Assistant:

TEST(FFT, Benchmark1e4) {
    int n = 1e4;
    int range = 1e5; //numbers from -range to range
    vector<ll> p1(n), p2(n);
    rep(j, 0, p1.size()) p1[j] = rand() % (2 * range) - range;
    rep(j, 0, p2.size()) p2[j] = rand() % (2 * range) - range;
    vector<ll> res = multiplyPolynomials(p1, p2);
    p1.resize(10), p2.resize(10);
    vector<ll> want = multiplyNaive(p1, p2);
    want.resize(10), res.resize(10);
    EXPECT_EQ(want, res);
}